

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_verify_pss.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  mbedtls_rsa_context *ctx;
  FILE *__stream;
  mbedtls_md_info_t *md_info;
  char local_668 [8];
  char filename [512];
  uchar buf [1024];
  uchar hash [32];
  undefined1 local_40 [8];
  mbedtls_pk_context pk;
  size_t i;
  int ret;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  i._4_4_ = 1;
  mbedtls_pk_init((mbedtls_pk_context *)local_40);
  if (argc == 3) {
    printf("\n  . Reading public key from \'%s\'",argv[1]);
    fflush(_stdout);
    i._4_4_ = mbedtls_pk_parse_public_keyfile((mbedtls_pk_context *)local_40,argv[1]);
    if (i._4_4_ == 0) {
      iVar1 = mbedtls_pk_can_do((mbedtls_pk_context *)local_40,MBEDTLS_PK_RSA);
      if (iVar1 == 0) {
        i._4_4_ = 1;
        printf(" failed\n  ! Key is not an RSA key\n");
      }
      else {
        ctx = mbedtls_pk_rsa(_local_40);
        mbedtls_rsa_set_padding(ctx,1,6);
        i._4_4_ = 1;
        snprintf(local_668,0x200,"%s.sig",argv[2]);
        __stream = fopen(local_668,"rb");
        if (__stream == (FILE *)0x0) {
          printf("\n  ! Could not open %s\n\n",local_668);
        }
        else {
          pk.pk_ctx = (void *)fread(filename + 0x1f8,1,0x400,__stream);
          fclose(__stream);
          printf("\n  . Verifying the RSA/SHA-256 signature");
          fflush(_stdout);
          md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
          i._4_4_ = mbedtls_md_file(md_info,argv[2],buf + 0x3f8);
          if (i._4_4_ == 0) {
            i._4_4_ = mbedtls_pk_verify((mbedtls_pk_context *)local_40,MBEDTLS_MD_SHA256,buf + 0x3f8
                                        ,0,(uchar *)(filename + 0x1f8),(size_t)pk.pk_ctx);
            if (i._4_4_ == 0) {
              printf("\n  . OK (the signature is valid)\n\n");
              i._4_4_ = 0;
            }
            else {
              printf(" failed\n  ! mbedtls_pk_verify returned %d\n\n",(ulong)i._4_4_);
            }
          }
          else {
            printf(" failed\n  ! Could not open or read %s\n\n",argv[2]);
          }
        }
      }
    }
    else {
      printf(" failed\n  ! Could not read key from \'%s\'\n",argv[1]);
      printf("  ! mbedtls_pk_parse_public_keyfile returned %d\n\n",(ulong)i._4_4_);
    }
  }
  else {
    printf("usage: rsa_verify_pss <key_file> <filename>\n");
  }
  mbedtls_pk_free((mbedtls_pk_context *)local_40);
  return i._4_4_;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret = 1;
    size_t i;
    mbedtls_pk_context pk;
    unsigned char hash[32];
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    char filename[512];

    mbedtls_pk_init( &pk );

    if( argc != 3 )
    {
        mbedtls_printf( "usage: rsa_verify_pss <key_file> <filename>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Reading public key from '%s'", argv[1] );
    fflush( stdout );

    if( ( ret = mbedtls_pk_parse_public_keyfile( &pk, argv[1] ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not read key from '%s'\n", argv[1] );
        mbedtls_printf( "  ! mbedtls_pk_parse_public_keyfile returned %d\n\n", ret );
        goto exit;
    }

    if( !mbedtls_pk_can_do( &pk, MBEDTLS_PK_RSA ) )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Key is not an RSA key\n" );
        goto exit;
    }

    mbedtls_rsa_set_padding( mbedtls_pk_rsa( pk ), MBEDTLS_RSA_PKCS_V21, MBEDTLS_MD_SHA256 );

    /*
     * Extract the RSA signature from the file
     */
    ret = 1;
    mbedtls_snprintf( filename, 512, "%s.sig", argv[2] );

    if( ( f = fopen( filename, "rb" ) ) == NULL )
    {
        mbedtls_printf( "\n  ! Could not open %s\n\n", filename );
        goto exit;
    }


    i = fread( buf, 1, MBEDTLS_MPI_MAX_SIZE, f );

    fclose( f );

    /*
     * Compute the SHA-256 hash of the input file and
     * verify the signature
     */
    mbedtls_printf( "\n  . Verifying the RSA/SHA-256 signature" );
    fflush( stdout );

    if( ( ret = mbedtls_md_file(
                    mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ),
                    argv[2], hash ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not open or read %s\n\n", argv[2] );
        goto exit;
    }

    if( ( ret = mbedtls_pk_verify( &pk, MBEDTLS_MD_SHA256, hash, 0,
                           buf, i ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_verify returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( "\n  . OK (the signature is valid)\n\n" );

    ret = 0;

exit:
    mbedtls_pk_free( &pk );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}